

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

void install_units(char *s1,char *s2)

{
  table *ptVar1;
  char *in_RDI;
  int i;
  table *tp;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  char *in_stack_ffffffffffffffe8;
  
  if (UnitsOn != 0) {
    Unit_push((char *)0x121756);
    ptVar1 = hash(in_stack_ffffffffffffffe8);
    if (ptVar1->name != (char *)0x0) {
      printf("Redefinition of units (%s) to:",in_RDI);
      units((unit *)0x121790);
      printf(" is ignored.\nThey remain:");
      Unit_push((char *)0x1217a8);
      units((unit *)0x1217b4);
      diag((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8);
    }
    ptVar1->name = in_RDI;
    ptVar1->factor = usp->factor;
    for (iVar2 = 0; iVar2 < 10; iVar2 = iVar2 + 1) {
      ptVar1->dim[iVar2] = usp->dim[iVar2];
    }
    unit_pop();
  }
  return;
}

Assistant:

void install_units(s1, s2) /* define s1 as s2 */
	char *s1, *s2;
{
	struct table *tp;
	int i;
	
	IFUNITS
	Unit_push(s2);
	tp = hash(s1);
	if (tp->name) {
		printf("Redefinition of units (%s) to:", s1);
		units(usp);
		printf(" is ignored.\nThey remain:");
		Unit_push(s1); units(usp);		
		diag("Units redefinition", (char *)0);
	}
	tp->name = s1;
	tp->factor = usp->factor;
	for (i=0; i<NDIM; i++) {
		tp->dim[i] = usp->dim[i];
	}
	unit_pop();
}